

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::printIntensity(Station *this,bool vector_form)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  reference pvVar4;
  double *pdVar5;
  size_type sVar6;
  byte in_SIL;
  long in_RDI;
  int j_1;
  int i_2;
  int j;
  int i_1;
  int i;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  
  if ((in_SIL & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Angle ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 8));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout," aperture intensities: ");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),1);
    std::ostream::operator<<(&std::cout,*pvVar4);
    for (local_10 = 1; local_10 < *(int *)(in_RDI + 0x40); local_10 = local_10 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,", ");
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)local_10);
      std::ostream::operator<<(poVar2,*pvVar4);
    }
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2," intensity matrix:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_14 = 0; iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
        local_14 < iVar1; local_14 = local_14 + 1) {
      for (local_18 = 0; iVar1 = Collimator::getYdim(*(Collimator **)(in_RDI + 0xb0)),
          local_18 < iVar1; local_18 = local_18 + 1) {
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
        printf("%2.0f ",*pdVar5);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    for (local_1c = 0; iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
        local_1c < iVar1; local_1c = local_1c + 1) {
      for (local_20 = 0; iVar1 = Collimator::getYdim(*(Collimator **)(in_RDI + 0xb0)),
          local_20 < iVar1; local_20 = local_20 + 1) {
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_1c,local_20);
        if ((*pdVar5 != -1.0) || (NAN(*pdVar5))) {
          pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_1c,local_20);
          printf("\t%2.1f",*pdVar5);
        }
      }
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"nb_intensities:");
  sVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::size
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x1354ce);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,sVar6);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Station::printIntensity(bool vector_form) {
	  if(!vector_form){
		  cout << "Angle "<< angle << endl; 
	    cout << " aperture intensities: ";
	    cout << intensity[1];
	    for (int i=1;i<max_apertures;i++)
	      cout << ", " << intensity[i];
	    cout << endl <<" intensity matrix:"<< endl;
		  for (int i=0; i<collimator.getXdim();i++) {
			  for (int j=0; j<collimator.getYdim(); j++) {
				  printf("%2.0f ", I(i,j));
			  }
			  cout << endl;
		  }
	  }else{
		  for (int i=0; i<collimator.getXdim();i++) {
			  for (int j=0; j<collimator.getYdim(); j++) {
				  if(I(i,j)!=-1.0) printf("\t%2.1f", I(i,j));
			  }
		  }
	  }

    cout << "nb_intensities:" << int2nb.size() << endl;
  }